

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidDelegate.cpp
# Opt level: O0

void __thiscall MeshLib::SolidDelegate::removeFace2(SolidDelegate *this,Solid *pS,Face *f)

{
  bool bVar1;
  tHalfEdge pHVar2;
  Vertex **ppVVar3;
  HalfEdge **ppHVar4;
  EditVertexTrait *this_00;
  List<MeshLib::HalfEdge> *list;
  HalfEdge *pHVar5;
  Trait **ppTVar6;
  HalfEdge *he_1;
  undefined1 local_80 [8];
  ListIterator<MeshLib::HalfEdge> liter;
  Vertex *vt;
  HalfEdge *he;
  undefined1 local_50 [8];
  FaceHalfedgeIterator fhiter;
  int i;
  HalfEdge *helist [3];
  Face *f_local;
  Solid *pS_local;
  SolidDelegate *this_local;
  
  if (f != (Face *)0x0) {
    fhiter.m_halfedge._4_4_ = 0;
    helist[2] = (HalfEdge *)f;
    FaceHalfedgeIterator::FaceHalfedgeIterator
              ((FaceHalfedgeIterator *)local_50,(tFace *)(helist + 2));
    while (bVar1 = FaceHalfedgeIterator::end((FaceHalfedgeIterator *)local_50),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      pHVar2 = FaceHalfedgeIterator::operator*((FaceHalfedgeIterator *)local_50);
      *(tHalfEdge *)(&stack0xffffffffffffffc8 + (long)fhiter.m_halfedge._4_4_ * 8) = pHVar2;
      fhiter.m_halfedge._4_4_ = fhiter.m_halfedge._4_4_ + 1;
      FaceHalfedgeIterator::operator++((FaceHalfedgeIterator *)local_50);
    }
    FaceHalfedgeIterator::~FaceHalfedgeIterator((FaceHalfedgeIterator *)local_50);
    for (fhiter.m_halfedge._4_4_ = 0; fhiter.m_halfedge._4_4_ < 3;
        fhiter.m_halfedge._4_4_ = fhiter.m_halfedge._4_4_ + 1) {
      ppVVar3 = HalfEdge::target(*(HalfEdge **)
                                  (&stack0xffffffffffffffc8 + (long)fhiter.m_halfedge._4_4_ * 8));
      liter.m_list = (List<MeshLib::HalfEdge> *)*ppVVar3;
      ppHVar4 = Vertex::halfedge((Vertex *)liter.m_list);
      if (*ppHVar4 == *(HalfEdge **)(&stack0xffffffffffffffc8 + (long)fhiter.m_halfedge._4_4_ * 8))
      {
        this_00 = trait<MeshLib::EditVertexTrait,MeshLib::Vertex>((Vertex *)liter.m_list);
        list = EditVertexTrait::hlist(this_00);
        ListIterator<MeshLib::HalfEdge>::ListIterator
                  ((ListIterator<MeshLib::HalfEdge> *)local_80,list);
        while (bVar1 = ListIterator<MeshLib::HalfEdge>::end
                                 ((ListIterator<MeshLib::HalfEdge> *)local_80),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          pHVar5 = ListIterator<MeshLib::HalfEdge>::operator*
                             ((ListIterator<MeshLib::HalfEdge> *)local_80);
          if (pHVar5 != *(HalfEdge **)(&stack0xffffffffffffffc8 + (long)fhiter.m_halfedge._4_4_ * 8)
             ) {
            ppHVar4 = Vertex::halfedge((Vertex *)liter.m_list);
            *ppHVar4 = pHVar5;
            break;
          }
          ListIterator<MeshLib::HalfEdge>::operator++((ListIterator<MeshLib::HalfEdge> *)local_80);
        }
        ListIterator<MeshLib::HalfEdge>::~ListIterator((ListIterator<MeshLib::HalfEdge> *)local_80);
      }
    }
    for (fhiter.m_halfedge._4_4_ = 0; fhiter.m_halfedge._4_4_ < 3;
        fhiter.m_halfedge._4_4_ = fhiter.m_halfedge._4_4_ + 1) {
      removeHalfedge(this,pS,*(HalfEdge **)
                              (&stack0xffffffffffffffc8 + (long)fhiter.m_halfedge._4_4_ * 8));
    }
    AVL::Tree<MeshLib::Face>::remove(&pS->m_faces,(char *)helist[2]);
    ppTVar6 = Face::trait((Face *)helist[2]);
    if (*ppTVar6 != (Trait *)0x0) {
      ppTVar6 = Face::trait((Face *)helist[2]);
      Trait::clear(ppTVar6);
    }
    pHVar5 = helist[2];
    if (helist[2] != (HalfEdge *)0x0) {
      Face::~Face((Face *)helist[2]);
      operator_delete(pHVar5);
    }
  }
  return;
}

Assistant:

void SolidDelegate::removeFace2(Solid *pS,  Face * f )
{
	if( f == NULL ) return;

	HalfEdge * helist[3];

	int i =0;
	for( FaceHalfedgeIterator fhiter(f); !fhiter.end(); ++fhiter)
	{
		HalfEdge * he = *fhiter;
		helist[i] = he;
		i++;
	}
	
	for( i =0; i < 3; i++)
	{
		Vertex *vt = helist[i]->target();
		if( vt->halfedge() == helist[i])
		{
			for( ListIterator<HalfEdge> liter( *v_edit_halfedge(vt)); !liter.end(); ++liter)
			{
				HalfEdge *he = *liter;
				if( he != helist[i])
				{
					vt->halfedge() = he;
					break;
				}
			}
		}
	}
	for( i = 0; i < 3; i ++ )
	{
		removeHalfedge(pS, helist[i] );
	}


	pS->m_faces.remove( f );

	if( f->trait() != NULL )
	{
		Trait::clear( f->trait() );
	}
	delete f;
}